

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int ARKodeSetMinStep(void *arkode_mem,sunrealtype hmin)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x426;
  }
  else {
    if (*(int *)((long)arkode_mem + 0xf0) != 0) {
      if (hmin <= 0.0) {
        *(undefined8 *)((long)arkode_mem + 0x2a8) = 0;
      }
      else {
        if (1.0 < *(double *)((long)arkode_mem + 0x2b0) * hmin) {
          msgfmt = "Inconsistent step size limits: hmin > hmax.";
          error_code = -0x16;
          line = 0x43e;
          goto LAB_0013302e;
        }
        *(sunrealtype *)((long)arkode_mem + 0x2a8) = hmin;
      }
      return 0;
    }
    msgfmt = "time-stepping module does not support temporal adaptivity";
    error_code = -0x30;
    line = 0x42f;
  }
LAB_0013302e:
  arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeSetMinStep",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int ARKodeSetMinStep(void* arkode_mem, sunrealtype hmin)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* Passing a value <= 0 sets hmin = 0 */
  if (hmin <= ZERO)
  {
    ark_mem->hmin = ZERO;
    return (ARK_SUCCESS);
  }

  /* check that hmin and hmax are agreeable */
  if (hmin * ark_mem->hmax_inv > ONE)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_HMIN_HMAX);
    return (ARK_ILL_INPUT);
  }

  /* set the value */
  ark_mem->hmin = hmin;

  return (ARK_SUCCESS);
}